

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O3

void __thiscall
icu_63::NFRuleSet::setDecimalFormatSymbols
          (NFRuleSet *this,DecimalFormatSymbols *newSymbols,UErrorCode *status)

{
  NFRule *newRule;
  uint uVar1;
  int32_t nonNumericalIdx;
  ulong uVar2;
  long lVar3;
  uint32_t fIdx;
  
  if ((this->rules).fCount != 0) {
    uVar2 = 0;
    do {
      NFRule::setDecimalFormatSymbols((this->rules).fStuff[uVar2],newSymbols,status);
      uVar2 = uVar2 + 1;
    } while (uVar2 < (this->rules).fCount);
  }
  uVar1 = (this->fractionRules).fCount;
  lVar3 = 1;
  do {
    if ((this->nonNumericalRules[lVar3] != (NFRule *)0x0) && (uVar1 != 0)) {
      uVar2 = 0;
      do {
        newRule = (this->fractionRules).fStuff[uVar2];
        if (this->nonNumericalRules[lVar3]->baseValue == newRule->baseValue) {
          setBestFractionRule(this,(int32_t)lVar3,newRule,'\0');
          uVar1 = (this->fractionRules).fCount;
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < uVar1);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  lVar3 = 0;
  do {
    if (this->nonNumericalRules[lVar3] != (NFRule *)0x0) {
      NFRule::setDecimalFormatSymbols(this->nonNumericalRules[lVar3],newSymbols,status);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  return;
}

Assistant:

void
NFRuleSet::setDecimalFormatSymbols(const DecimalFormatSymbols &newSymbols, UErrorCode& status) {
    for (uint32_t i = 0; i < rules.size(); ++i) {
        rules[i]->setDecimalFormatSymbols(newSymbols, status);
    }
    // Switch the fraction rules to mirror the DecimalFormatSymbols.
    for (int32_t nonNumericalIdx = IMPROPER_FRACTION_RULE_INDEX; nonNumericalIdx <= MASTER_RULE_INDEX; nonNumericalIdx++) {
        if (nonNumericalRules[nonNumericalIdx]) {
            for (uint32_t fIdx = 0; fIdx < fractionRules.size(); fIdx++) {
                NFRule *fractionRule = fractionRules[fIdx];
                if (nonNumericalRules[nonNumericalIdx]->getBaseValue() == fractionRule->getBaseValue()) {
                    setBestFractionRule(nonNumericalIdx, fractionRule, FALSE);
                }
            }
        }
    }

    for (uint32_t nnrIdx = 0; nnrIdx < NON_NUMERICAL_RULE_LENGTH; nnrIdx++) {
        NFRule *rule = nonNumericalRules[nnrIdx];
        if (rule) {
            rule->setDecimalFormatSymbols(newSymbols, status);
        }
    }
}